

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_move_16_ai_d(void)

{
  uint value;
  uint ea;
  uint res;
  
  value = m68ki_cpu.dar[m68ki_cpu.ir & 7] & 0xffff;
  m68ki_write_16_fc(m68ki_cpu.dar[(ulong)(m68ki_cpu.ir >> 9 & 7) + 8],m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value >> 8;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_16_ai_d(void)
{
	uint res = MASK_OUT_ABOVE_16(DY);
	uint ea = EA_AX_AI_16();

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}